

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall OpenMD::SquareMatrix<double,_3>::SquareMatrix(SquareMatrix<double,_3> *this)

{
  RectMatrix<double,_3U,_3U> *in_RDI;
  uint j;
  uint i;
  uint local_10;
  uint local_c;
  
  RectMatrix<double,_3U,_3U>::RectMatrix(in_RDI);
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
      in_RDI->data_[local_c][local_10] = 0.0;
    }
  }
  return;
}

Assistant:

SquareMatrix() {
      for (unsigned int i = 0; i < Dim; i++)
        for (unsigned int j = 0; j < Dim; j++)
          this->data_[i][j] = 0.0;
    }